

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qharfbuzzng.cpp
# Opt level: O0

void anon_unknown.dwarf_1a692d7::Q_QGS_qt_ffuncs::innerFunction(void *pointer)

{
  _hb_qt_font_funcs_t::_hb_qt_font_funcs_t((_hb_unicode_funcs_t *)pointer);
  return;
}

Assistant:

static hb_blob_t *
_hb_qt_reference_table(hb_face_t * /*face*/, hb_tag_t tag, void *user_data)
{
    QFontEngine::FaceData *data = static_cast<QFontEngine::FaceData *>(user_data);
    Q_ASSERT(data);

    qt_get_font_table_func_t get_font_table = data->get_font_table;
    Q_ASSERT(get_font_table);

    uint length = 0;
    if (Q_UNLIKELY(!get_font_table(data->user_data, tag, 0, &length)))
        return hb_blob_get_empty();

    char *buffer = static_cast<char *>(malloc(length));
    if (q_check_ptr(buffer) == nullptr)
        return nullptr;

    if (Q_UNLIKELY(!get_font_table(data->user_data, tag, reinterpret_cast<uchar *>(buffer), &length)))
        return nullptr;

    return hb_blob_create(const_cast<const char *>(buffer), length,
                          HB_MEMORY_MODE_WRITABLE,
                          buffer, free);
}